

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5VocabOpenMethod(sqlite3_vtab *pVTab,sqlite3_vtab_cursor **ppCsr)

{
  char *pcVar1;
  undefined8 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  i64 nByte;
  i64 iId;
  char *zSql;
  Fts5VocabCursor *pCsr;
  Fts5Table *pFts5;
  Fts5VocabTable *pTab;
  sqlite3_stmt *pStmt;
  int rc;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  char **in_stack_ffffffffffffffa0;
  sqlite3_stmt *in_stack_ffffffffffffffa8;
  char *pcVar2;
  sqlite3 *db;
  long lVar3;
  int local_1c;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db = (sqlite3 *)0x0;
  pcVar2 = (char *)0x0;
  local_c = 0;
  if (*(int *)(in_RDI + 0x3c) == 0) {
    lVar3 = in_RDI;
    pcVar1 = sqlite3Fts5Mprintf(&local_c,"SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH \'*id\'",
                                *(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x20),
                                *(undefined8 *)(in_RDI + 0x18),*(undefined8 *)(in_RDI + 0x18));
    if (pcVar1 != (char *)0x0) {
      local_c = sqlite3_prepare_v2(db,pcVar2,(int)((ulong)pcVar1 >> 0x20),
                                   (sqlite3_stmt **)in_stack_ffffffffffffffa8,
                                   in_stack_ffffffffffffffa0);
    }
    sqlite3_free((void *)0x2943ae);
    if (local_c == 1) {
      local_c = 0;
    }
    *(undefined4 *)(lVar3 + 0x3c) = 1;
    *(undefined4 *)(lVar3 + 0x3c) = 0;
    if (local_c == 0) {
      if (db == (sqlite3 *)0x0) {
        local_c = sqlite3_finalize(in_stack_ffffffffffffffa8);
        if (local_c == 0) {
          pcVar1 = sqlite3_mprintf("no such fts5 table: %s.%s",*(undefined8 *)(lVar3 + 0x20),
                                   *(undefined8 *)(lVar3 + 0x18));
          *(char **)(in_RDI + 0x10) = pcVar1;
          local_c = 1;
        }
      }
      else {
        local_c = sqlite3Fts5FlushToDisk((Fts5Table *)0x294482);
      }
    }
    if (local_c == 0) {
      pcVar2 = (char *)sqlite3Fts5MallocZero
                                 ((int *)((long)*(int *)((long)&db->mutex->mutex + 0x20) * 0x10 +
                                         0x80),
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    }
    if (pcVar2 == (char *)0x0) {
      sqlite3_finalize(in_stack_ffffffffffffffa8);
    }
    else {
      *(sqlite3 **)(pcVar2 + 0x10) = db;
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = '\0';
      pcVar2[0xd] = '\0';
      pcVar2[0xe] = '\0';
      pcVar2[0xf] = '\0';
      *(char **)(pcVar2 + 0x48) = pcVar2 + 0x80;
      *(long *)(pcVar2 + 0x50) =
           *(long *)(pcVar2 + 0x48) + (long)*(int *)((long)&db->mutex->mutex + 0x20) * 8;
    }
    *in_RSI = pcVar2;
    local_1c = local_c;
  }
  else {
    pcVar2 = sqlite3_mprintf("recursive definition for %s.%s",*(undefined8 *)(in_RDI + 0x20),
                             *(undefined8 *)(in_RDI + 0x18));
    *(char **)(in_RDI + 0x10) = pcVar2;
    local_1c = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1c;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5VocabOpenMethod(
  sqlite3_vtab *pVTab,
  sqlite3_vtab_cursor **ppCsr
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pVTab;
  Fts5Table *pFts5 = 0;
  Fts5VocabCursor *pCsr = 0;
  int rc = SQLITE_OK;
  sqlite3_stmt *pStmt = 0;
  char *zSql = 0;

  if( pTab->bBusy ){
    pVTab->zErrMsg = sqlite3_mprintf(
       "recursive definition for %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
    );
    return SQLITE_ERROR;
  }
  zSql = sqlite3Fts5Mprintf(&rc,
      "SELECT t.%Q FROM %Q.%Q AS t WHERE t.%Q MATCH '*id'",
      pTab->zFts5Tbl, pTab->zFts5Db, pTab->zFts5Tbl, pTab->zFts5Tbl
  );
  if( zSql ){
    rc = sqlite3_prepare_v2(pTab->db, zSql, -1, &pStmt, 0);
  }
  sqlite3_free(zSql);
  assert( rc==SQLITE_OK || pStmt==0 );
  if( rc==SQLITE_ERROR ) rc = SQLITE_OK;

  pTab->bBusy = 1;
  if( pStmt && sqlite3_step(pStmt)==SQLITE_ROW ){
    i64 iId = sqlite3_column_int64(pStmt, 0);
    pFts5 = sqlite3Fts5TableFromCsrid(pTab->pGlobal, iId);
  }
  pTab->bBusy = 0;

  if( rc==SQLITE_OK ){
    if( pFts5==0 ){
      rc = sqlite3_finalize(pStmt);
      pStmt = 0;
      if( rc==SQLITE_OK ){
        pVTab->zErrMsg = sqlite3_mprintf(
            "no such fts5 table: %s.%s", pTab->zFts5Db, pTab->zFts5Tbl
        );
        rc = SQLITE_ERROR;
      }
    }else{
      rc = sqlite3Fts5FlushToDisk(pFts5);
    }
  }

  if( rc==SQLITE_OK ){
    i64 nByte = pFts5->pConfig->nCol * sizeof(i64)*2 + sizeof(Fts5VocabCursor);
    pCsr = (Fts5VocabCursor*)sqlite3Fts5MallocZero(&rc, nByte);
  }

  if( pCsr ){
    pCsr->pFts5 = pFts5;
    pCsr->pStmt = pStmt;
    pCsr->aCnt = (i64*)&pCsr[1];
    pCsr->aDoc = &pCsr->aCnt[pFts5->pConfig->nCol];
  }else{
    sqlite3_finalize(pStmt);
  }

  *ppCsr = (sqlite3_vtab_cursor*)pCsr;
  return rc;
}